

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindowSettings * ImGui::FindWindowSettingsByWindow(ImGuiWindow *window)

{
  ImVec2ih *pIVar1;
  int iVar2;
  ImGuiWindowSettings *pIVar3;
  
  if ((long)window->SettingsOffset != -1) {
    return (ImGuiWindowSettings *)((GImGui->SettingsWindows).Buf.Data + window->SettingsOffset);
  }
  pIVar3 = (ImGuiWindowSettings *)(GImGui->SettingsWindows).Buf.Data;
  pIVar1 = &pIVar3->Pos;
  if (pIVar3 != (ImGuiWindowSettings *)0x0) {
    pIVar3 = (ImGuiWindowSettings *)pIVar1;
    while ((pIVar3->ID != window->ID || (pIVar3->WantDelete == true))) {
      iVar2._0_1_ = pIVar3[-1].Collapsed;
      iVar2._1_1_ = pIVar3[-1].IsChild;
      iVar2._2_1_ = pIVar3[-1].WantApply;
      iVar2._3_1_ = pIVar3[-1].WantDelete;
      pIVar3 = (ImGuiWindowSettings *)((long)&pIVar3->ID + (long)iVar2);
      if (pIVar3 == (ImGuiWindowSettings *)
                    ((long)&pIVar1->x + (long)(GImGui->SettingsWindows).Buf.Size)) {
        return (ImGuiWindowSettings *)0x0;
      }
    }
  }
  return pIVar3;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettingsByWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (window->SettingsOffset != -1)
        return g.SettingsWindows.ptr_from_offset(window->SettingsOffset);
    return FindWindowSettingsByID(window->ID);
}